

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O1

double __thiscall chrono::ChSolverADMM::_SolveBasic(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  _func_int **pp_Var5;
  ChSparseMatrix *pCVar6;
  size_t sVar7;
  double dVar8;
  ChConstraint *pCVar9;
  element_type *peVar10;
  StorageIndex *pSVar11;
  Index IVar12;
  Index IVar13;
  StorageIndex *pSVar14;
  Scalar *pSVar15;
  StorageIndex *pSVar16;
  Index IVar17;
  Index IVar18;
  double *pdVar19;
  double *pdVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  _func_int *p_Var27;
  _func_int *p_Var28;
  _func_int *p_Var29;
  _func_int *p_Var30;
  _func_int *p_Var31;
  _func_int *p_Var32;
  _func_int *p_Var33;
  _func_int **pp_Var34;
  undefined8 uVar35;
  uint uVar36;
  uint nrows;
  int iVar37;
  Index size;
  pointer ppCVar38;
  Scalar *pSVar39;
  ChLog *pCVar40;
  ChStreamOutAscii *pCVar41;
  Index dstRows;
  char *pcVar42;
  uint uVar43;
  Index index;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  pointer ppCVar49;
  ulong uVar50;
  int iVar51;
  Index index_12;
  long lVar52;
  ActualDstType actualDst;
  ActualDstType actualDst_2;
  long rows;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  double __tmp;
  Scalar SVar55;
  undefined1 auVar56 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar65 [64];
  undefined1 auVar61 [16];
  undefined1 auVar66 [64];
  undefined1 auVar62 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  double __tmp_2;
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ChVectorDynamic<> z;
  ChVectorDynamic<> l;
  ChVectorDynamic<> S;
  assign_op<double,_double> local_3d9;
  ChVectorDynamic<> vrho;
  ChVectorDynamic<> y;
  double local_3b0;
  double local_3a8;
  double local_398;
  ChVectorDynamic<> z_old;
  ChSparseMatrix H;
  ChVectorDynamic<> l_old;
  ChVectorDynamic<> b;
  SrcEvaluatorType srcEvaluator;
  ChVectorDynamic<> IS;
  ChVectorDynamic<> B;
  ChVectorDynamic<> v;
  ChVectorDynamic<double> *local_2a0;
  long local_298;
  long local_290;
  long local_288;
  double __tmp_1;
  ulong local_278;
  double local_270;
  Scalar local_268;
  undefined8 uStack_260;
  ChVectorDynamic<> vsigma;
  ChVectorDynamic<> y_old;
  undefined1 local_228 [16];
  assign_op<double,_double> *local_218;
  ChSparseMatrix *local_210;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_208;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_200;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_1f8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_1f0;
  ChVectorDynamic<> k;
  ChSparseMatrix A;
  ChSparseMatrix Cq;
  DstEvaluatorType dstEvaluator;
  ChSparsityPatternLearner sparsity_pattern;
  ChSparseMatrix E;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  __tmp_1 = this->rho;
  uVar36 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  uVar44 = (ulong)uVar36;
  nrows = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  lVar47 = (long)(int)nrows;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar47);
  if (uVar36 == 0) {
    H._8_8_ = H._8_8_ & 0xffffffffffffff00;
    H._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    H.m_outerSize = 0;
    H.m_innerSize = 0;
    H.m_outerIndex = (StorageIndex *)0x0;
    H.m_innerNonZeros = (StorageIndex *)0x0;
    H.m_data.m_values = (Scalar *)0x0;
    H.m_data.m_indices = (StorageIndex *)0x0;
    H.m_data.m_size = 0;
    H.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&H,lVar47,lVar47);
    Cq._vptr_SparseMatrix = (_func_int **)0x0;
    Cq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
    Cq._9_7_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Cq,lVar47);
    lVar47 = std::chrono::_V2::system_clock::now();
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nrows,nrows);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&H);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&H,&Cq);
    peVar10 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (H.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
        super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
      pSVar11 = (peVar10->m_mat).m_outerIndex;
      (peVar10->m_mat).m_outerIndex = H.m_outerIndex;
      IVar12 = (peVar10->m_mat).m_innerSize;
      (peVar10->m_mat).m_innerSize = H.m_innerSize;
      IVar13 = (peVar10->m_mat).m_outerSize;
      (peVar10->m_mat).m_outerSize = H.m_outerSize;
      pSVar14 = (peVar10->m_mat).m_innerNonZeros;
      (peVar10->m_mat).m_innerNonZeros = H.m_innerNonZeros;
      pSVar15 = (peVar10->m_mat).m_data.m_values;
      (peVar10->m_mat).m_data.m_values = H.m_data.m_values;
      pSVar16 = (peVar10->m_mat).m_data.m_indices;
      (peVar10->m_mat).m_data.m_indices = H.m_data.m_indices;
      IVar17 = (peVar10->m_mat).m_data.m_size;
      (peVar10->m_mat).m_data.m_size = H.m_data.m_size;
      IVar18 = (peVar10->m_mat).m_data.m_allocatedSize;
      (peVar10->m_mat).m_data.m_allocatedSize = H.m_data.m_allocatedSize;
      H.m_outerSize = IVar13;
      H.m_innerSize = IVar12;
      H.m_outerIndex = pSVar11;
      H.m_innerNonZeros = pSVar14;
      H.m_data.m_values = pSVar15;
      H.m_data.m_indices = pSVar16;
      H.m_data.m_size = IVar17;
      H.m_data.m_allocatedSize = IVar18;
    }
    else {
      pCVar6 = &peVar10->m_mat;
      if (pCVar6 != &H) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,&H);
        if (H.m_innerNonZeros == (StorageIndex *)0x0) {
          sVar7 = (peVar10->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar10->m_mat).m_outerIndex,H.m_outerIndex,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar10->m_mat).m_data,&H.m_data);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,&H);
        }
      }
    }
    uVar35 = Cq._8_8_;
    pp_Var34 = Cq._vptr_SparseMatrix;
    peVar10 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != Cq._8_8_) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 Cq._8_8_,1);
    }
    uVar44 = (peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (uVar44 == uVar35) {
      pdVar20 = (peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar45 = uVar44 + 7;
      if (-1 < (long)uVar44) {
        uVar45 = uVar44;
      }
      uVar45 = uVar45 & 0xfffffffffffffff8;
      if (7 < (long)uVar44) {
        lVar52 = 0;
        do {
          pp_Var5 = pp_Var34 + lVar52;
          p_Var27 = pp_Var5[1];
          p_Var28 = pp_Var5[2];
          p_Var29 = pp_Var5[3];
          p_Var30 = pp_Var5[4];
          p_Var31 = pp_Var5[5];
          p_Var32 = pp_Var5[6];
          p_Var33 = pp_Var5[7];
          pdVar19 = pdVar20 + lVar52;
          *pdVar19 = (double)*pp_Var5;
          pdVar19[1] = (double)p_Var27;
          pdVar19[2] = (double)p_Var28;
          pdVar19[3] = (double)p_Var29;
          pdVar19[4] = (double)p_Var30;
          pdVar19[5] = (double)p_Var31;
          pdVar19[6] = (double)p_Var32;
          pdVar19[7] = (double)p_Var33;
          lVar52 = lVar52 + 8;
        } while (lVar52 < (long)uVar45);
      }
      if ((long)uVar45 < (long)uVar44) {
        do {
          pdVar20[uVar45] = (double)pp_Var34[uVar45];
          uVar45 = uVar45 + 1;
        } while (uVar44 != uVar45);
      }
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar40 = GetLog();
        pCVar41 = ChStreamOutAscii::operator<<
                            (&pCVar40->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
        lVar52 = std::chrono::_V2::system_clock::now();
        pCVar41 = ChStreamOutAscii::operator<<(pCVar41,(double)(lVar52 - lVar47) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar41,"s\n");
      }
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
      (*sysd->_vptr_ChSystemDescriptor[0x11])
                (sysd,&((this->LS_solver).
                        super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_sol);
      ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
      if (Cq._vptr_SparseMatrix != (_func_int **)0x0) {
        free(Cq._vptr_SparseMatrix[-1]);
      }
      H._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
      free(H.m_outerIndex);
      free(H.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&H.m_data);
      local_398 = 0.0;
      goto LAB_007df12c;
    }
  }
  else {
    rows = (long)(int)uVar36;
    Cq._8_8_ = Cq._8_8_ & 0xffffffffffffff00;
    Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    Cq.m_outerSize = 0;
    Cq.m_innerSize = 0;
    Cq.m_outerIndex = (StorageIndex *)0x0;
    Cq.m_innerNonZeros = (StorageIndex *)0x0;
    Cq.m_data.m_values = (Scalar *)0x0;
    Cq.m_data.m_indices = (StorageIndex *)0x0;
    Cq.m_data.m_size = 0;
    Cq.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&Cq,rows,lVar47);
    E.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
    E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    E.m_outerSize = 0;
    E.m_innerSize = 0;
    E.m_outerIndex = (StorageIndex *)0x0;
    E.m_innerNonZeros = (StorageIndex *)0x0;
    E.m_data.m_values = (Scalar *)0x0;
    E.m_data.m_indices = (StorageIndex *)0x0;
    E.m_data.m_size = 0;
    E.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&E,rows,rows);
    k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar47);
    b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    iVar37 = nrows + uVar36;
    lVar52 = (long)iVar37;
    A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
    A._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
    A.m_outerSize = 0;
    A.m_innerSize = 0;
    A.m_outerIndex = (StorageIndex *)0x0;
    A.m_innerNonZeros = (StorageIndex *)0x0;
    A.m_data.m_values = (Scalar *)0x0;
    A.m_data.m_indices = (StorageIndex *)0x0;
    A.m_data.m_size = 0;
    A.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize(&A,lVar52,lVar52);
    B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar52);
    l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    (*sysd->_vptr_ChSystemDescriptor[0x1b])(sysd,&Cq,0,&E,&k,&b,0,0,0);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&Cq);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&E);
    local_278 = uVar44;
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007df59c;
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007df59c;
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007df59c;
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
    }
    else {
      (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&l,0);
      (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&v,0);
      if ((Cq.m_innerSize !=
           v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) ||
         (E.m_innerSize !=
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
        pcVar42 = 
        "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
        ;
        goto LAB_007df2ac;
      }
      if (Cq.m_outerSize != E.m_outerSize) {
        pcVar42 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007df451;
      }
      if (E.m_outerSize !=
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar42 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007df451;
      }
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize = (Index)&Cq;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerSize = (Index)&v;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerIndex = (StorageIndex *)&E;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerNonZeros = (StorageIndex *)&l;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_data.m_indices = (StorageIndex *)&b;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<double,double>>
                (&y,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&sparsity_pattern,(assign_op<double,_double> *)&H);
      IVar12 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar20 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ,1);
      }
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          IVar12) goto LAB_007df1ea;
      uVar44 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar44 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar44 = uVar44 & 0xfffffffffffffff8;
      if (7 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar48 = 0;
        do {
          pdVar19 = pdVar20 + lVar48;
          dVar70 = pdVar19[1];
          dVar8 = pdVar19[2];
          dVar22 = pdVar19[3];
          dVar23 = pdVar19[4];
          dVar24 = pdVar19[5];
          dVar25 = pdVar19[6];
          dVar26 = pdVar19[7];
          pdVar1 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + lVar48;
          *pdVar1 = *pdVar19;
          pdVar1[1] = dVar70;
          pdVar1[2] = dVar8;
          pdVar1[3] = dVar22;
          pdVar1[4] = dVar23;
          pdVar1[5] = dVar24;
          pdVar1[6] = dVar25;
          pdVar1[7] = dVar26;
          lVar48 = lVar48 + 8;
        } while (lVar48 < (long)uVar44);
      }
      if ((long)uVar44 <
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar44]
               = pdVar20[uVar44];
          uVar44 = uVar44 + 1;
        } while (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar44);
      }
    }
    S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (this->precond == true) {
      ppCVar38 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish == ppCVar38) {
        uVar44 = 0;
      }
      else {
        uVar45 = 0;
        uVar46 = 1;
        do {
          (*ppCVar38[uVar45]->_vptr_ChConstraint[6])();
          ppCVar38 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar44 = (long)(sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar38 >> 3;
          bVar21 = uVar46 < uVar44;
          uVar45 = uVar46;
          uVar46 = (ulong)((int)uVar46 + 1);
        } while (bVar21);
      }
      if (uVar44 != 0) {
        iVar51 = 0;
        uVar43 = 1;
        ppCVar49 = ppCVar38;
        do {
          pCVar9 = *ppCVar49;
          if (pCVar9->mode == CONSTRAINT_FRIC) {
            (&sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix)[iVar51] =
                 (_func_int **)pCVar9->g_i;
            iVar51 = iVar51 + 1;
            if (iVar51 == 3) {
              dVar70 = ((double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.
                                _vptr_SparseMatrix +
                        (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._8_8_ +
                       (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize) /
                       3.0;
              ppCVar38[uVar43 - 3]->g_i = dVar70;
              ppCVar38[uVar43 - 2]->g_i = dVar70;
              pCVar9->g_i = dVar70;
              iVar51 = 0;
            }
          }
          uVar45 = (ulong)uVar43;
          ppCVar49 = ppCVar49 + 1;
          uVar43 = uVar43 + 1;
        } while (uVar45 < uVar44);
      }
      if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
      goto LAB_007df59c;
      if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
        memset(S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
               S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3);
      }
      ppCVar38 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppCVar38) {
        iVar51 = 0;
        uVar44 = 0;
        uVar45 = 1;
        do {
          if (ppCVar38[uVar44]->active == true) {
            dVar70 = ppCVar38[uVar44]->g_i;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = dVar70;
            if (dVar70 < 0.0) {
              dVar70 = sqrt(dVar70);
            }
            else {
              auVar58 = vsqrtsd_avx(auVar58,auVar58);
              dVar70 = auVar58._0_8_;
            }
            if ((iVar51 < 0) ||
               (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
                iVar51)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [iVar51] = dVar70;
            iVar51 = iVar51 + 1;
          }
          ppCVar38 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar21 = uVar45 < (ulong)((long)(sysd->vconstraints).
                                          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppCVar38 >> 3);
          uVar44 = uVar45;
          uVar45 = (ulong)((int)uVar45 + 1);
        } while (bVar21);
      }
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      goto LAB_007df5ef;
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
LAB_007df609:
        pcVar42 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
        ;
        goto LAB_007df39f;
      }
      uVar44 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar44 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar44 = uVar44 & 0xfffffffffffffff8;
      if (7 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar48 = 0;
        do {
          auVar53 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (b.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar48),
                                   *(undefined1 (*) [64])
                                    (S.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar48));
          *(undefined1 (*) [64])
           (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar48) = auVar53;
          lVar48 = lVar48 + 8;
        } while (lVar48 < (long)uVar44);
      }
      if ((long)uVar44 <
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar44]
               = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar44] *
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar44];
          uVar44 = uVar44 + 1;
        } while (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar44);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
LAB_007df335:
        pcVar42 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
LAB_007df451:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar42);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar44 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 7;
        if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          uVar44 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        }
        uVar44 = uVar44 & 0xfffffffffffffff8;
        if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar48 = 0;
          do {
            auVar53 = vdivpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar48),
                                     *(undefined1 (*) [64])
                                      (S.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar48));
            *(undefined1 (*) [64])
             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar48) = auVar53;
            lVar48 = lVar48 + 8;
          } while (lVar48 < (long)uVar44);
        }
        if ((long)uVar44 <
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar44] = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar44] /
                       S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar44];
            uVar44 = uVar44 + 1;
          } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar44);
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007df335;
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          uVar44 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 7;
          if (-1 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            uVar44 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar44 = uVar44 & 0xfffffffffffffff8;
          if (7 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            lVar48 = 0;
            do {
              auVar53 = vdivpd_avx512f(*(undefined1 (*) [64])
                                        (z.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar48),
                                       *(undefined1 (*) [64])
                                        (S.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar48));
              *(undefined1 (*) [64])
               (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar48) = auVar53;
              lVar48 = lVar48 + 8;
            } while (lVar48 < (long)uVar44);
          }
          if ((long)uVar44 <
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar44] = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar44] /
                         S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar44];
              uVar44 = uVar44 + 1;
            } while (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar44);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007df5ef;
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            uVar44 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 7;
            if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) {
              uVar44 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
            }
            uVar44 = uVar44 & 0xfffffffffffffff8;
            if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              lVar48 = 0;
              do {
                auVar53 = vmulpd_avx512f(*(undefined1 (*) [64])
                                          (y.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar48),
                                         *(undefined1 (*) [64])
                                          (S.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar48));
                *(undefined1 (*) [64])
                 (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 + lVar48) = auVar53;
                lVar48 = lVar48 + 8;
              } while (lVar48 < (long)uVar44);
            }
            if ((long)uVar44 <
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
              do {
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar44] = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar44] *
                           S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar44];
                uVar44 = uVar44 + 1;
              } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows != uVar44);
            }
            goto LAB_007dd2fd;
          }
          goto LAB_007df609;
        }
      }
      pcVar42 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
      ;
      goto LAB_007df39f;
    }
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007df59c;
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      lVar48 = 0;
      do {
        *(undefined8 *)
         ((long)S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
         lVar48) = 0x3ff0000000000000;
        lVar48 = lVar48 + 8;
      } while (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <<
               3 != lVar48);
    }
LAB_007dd2fd:
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    {
LAB_007df59c:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
    {
      dVar70 = this->sigma;
      lVar48 = 0;
      do {
        *(double *)
         ((long)vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data + lVar48) = dVar70;
        lVar48 = lVar48 + 8;
      } while (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows << 3 != lVar48);
    }
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007df59c;
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      lVar48 = 0;
      do {
        *(double *)
         ((long)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         + lVar48) = __tmp_1;
        lVar48 = lVar48 + 8;
      } while (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               * 8 - lVar48 != 0);
    }
    ppCVar38 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar48 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar38;
    if (lVar48 != 0) {
      uVar44 = 0;
      uVar43 = 1;
      iVar51 = 0;
      do {
        pCVar9 = ppCVar38[uVar44];
        if (pCVar9->active == true) {
          if (pCVar9->mode == CONSTRAINT_LOCK) {
            if ((iVar51 < 0) ||
               (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                <= iVar51)) goto LAB_007df47d;
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [iVar51] = this->rho_b;
          }
          iVar51 = iVar51 + 1;
        }
        uVar44 = (ulong)uVar43;
        uVar43 = uVar43 + 1;
      } while (uVar44 < (ulong)(lVar48 >> 3));
    }
    lVar48 = std::chrono::_V2::system_clock::now();
    Eigen::SparseMatrix<double,_1,_int>::resize
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,lVar52,lVar52);
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,iVar37,iVar37);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&A);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&A,&B);
    if (this->precond == true) {
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar52);
      if ((int)nrows < 0) goto LAB_007df59c;
      local_298 = 0;
      local_290 = 1;
      local_2a0 = &IS;
      local_288 = lVar47;
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          lVar47) {
        pcVar42 = 
        "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
        ;
LAB_007df183:
        local_290 = 1;
        local_298 = 0;
        __assert_fail("m_xpr.rows() >= other.rows() && m_xpr.cols() >= other.cols() && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x2f,pcVar42);
      }
      local_210 = &H;
      H._vptr_SparseMatrix =
           (_func_int **)
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      H.m_outerSize = 1;
      H.m_outerIndex = (StorageIndex *)0x0;
      H.m_innerNonZeros = (StorageIndex *)0x0;
      H.m_data.m_values =
           (Scalar *)
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_228._8_8_ = &srcEvaluator;
      srcEvaluator.m_functor.m_other = 1.0;
      local_228._0_8_ = &dstEvaluator;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_data = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_outerStride.m_value =
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_218 = &local_3d9;
      H._8_8_ = lVar47;
      H.m_innerSize = (Index)&IS;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_228);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2a0,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      if ((local_288 + local_298 !=
           (local_2a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows) || (local_290 != 1)) {
LAB_007df25e:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          A.m_outerSize) {
        pcVar42 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::SparseMatrix<double, 1>, Option = 0]"
        ;
LAB_007df2ac:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar42);
      }
      H._vptr_SparseMatrix = (_func_int **)((ulong)H._vptr_SparseMatrix & 0xffffffffffffff00);
      H._8_8_ = H._8_8_ & 0xffffffffffffff00;
      H.m_outerSize = (Index)&IS;
      H.m_innerSize = (Index)&A;
      H.m_outerIndex = (StorageIndex *)&IS;
      if (A.m_innerSize !=
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar42 = 
        "Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, _Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 0]"
        ;
        goto LAB_007df2ac;
      }
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)&A,
                 (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)&H);
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar42 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, 1>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 1]"
        ;
        goto LAB_007df2ac;
      }
      if (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar42 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, 1>, 1>, T1 = double, T2 = double]"
        ;
        goto LAB_007df39f;
      }
      uVar44 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar44 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar44 = uVar44 & 0xfffffffffffffff8;
      if (7 < B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar52 = 0;
        do {
          auVar53 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (B.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar52),
                                   *(undefined1 (*) [64])
                                    (IS.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar52));
          *(undefined1 (*) [64])
           (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar52) = auVar53;
          lVar52 = lVar52 + 8;
        } while (lVar52 < (long)uVar44);
      }
      if ((long)uVar44 <
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar44]
               = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar44] *
                 B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar44];
          uVar44 = uVar44 + 1;
        } while (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar44);
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
    }
    peVar10 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
        super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
      pSVar11 = (peVar10->m_mat).m_outerIndex;
      (peVar10->m_mat).m_outerIndex = A.m_outerIndex;
      IVar12 = (peVar10->m_mat).m_innerSize;
      (peVar10->m_mat).m_innerSize = A.m_innerSize;
      IVar13 = (peVar10->m_mat).m_outerSize;
      (peVar10->m_mat).m_outerSize = A.m_outerSize;
      pSVar14 = (peVar10->m_mat).m_innerNonZeros;
      (peVar10->m_mat).m_innerNonZeros = A.m_innerNonZeros;
      pSVar15 = (peVar10->m_mat).m_data.m_values;
      (peVar10->m_mat).m_data.m_values = A.m_data.m_values;
      pSVar16 = (peVar10->m_mat).m_data.m_indices;
      (peVar10->m_mat).m_data.m_indices = A.m_data.m_indices;
      IVar17 = (peVar10->m_mat).m_data.m_size;
      (peVar10->m_mat).m_data.m_size = A.m_data.m_size;
      IVar18 = (peVar10->m_mat).m_data.m_allocatedSize;
      (peVar10->m_mat).m_data.m_allocatedSize = A.m_data.m_allocatedSize;
      A.m_outerSize = IVar13;
      A.m_innerSize = IVar12;
      A.m_outerIndex = pSVar11;
      A.m_innerNonZeros = pSVar14;
      A.m_data.m_values = pSVar15;
      A.m_data.m_indices = pSVar16;
      A.m_data.m_size = IVar17;
      A.m_data.m_allocatedSize = IVar18;
    }
    else {
      pCVar6 = &peVar10->m_mat;
      if (pCVar6 != &A) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,&A);
        if (A.m_innerNonZeros == (StorageIndex *)0x0) {
          sVar7 = (peVar10->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar10->m_mat).m_outerIndex,A.m_outerIndex,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar10->m_mat).m_data,&A.m_data);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,&A);
        }
      }
    }
    IVar12 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar20 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    peVar10 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                );
    }
    uVar44 = (peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (uVar44 == IVar12) {
      pdVar19 = (peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar45 = uVar44 + 7;
      if (-1 < (long)uVar44) {
        uVar45 = uVar44;
      }
      uVar45 = uVar45 & 0xfffffffffffffff8;
      if (7 < (long)uVar44) {
        lVar52 = 0;
        do {
          pdVar1 = pdVar20 + lVar52;
          dVar70 = pdVar1[1];
          dVar8 = pdVar1[2];
          dVar22 = pdVar1[3];
          dVar23 = pdVar1[4];
          dVar24 = pdVar1[5];
          dVar25 = pdVar1[6];
          dVar26 = pdVar1[7];
          pdVar2 = pdVar19 + lVar52;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar70;
          pdVar2[2] = dVar8;
          pdVar2[3] = dVar22;
          pdVar2[4] = dVar23;
          pdVar2[5] = dVar24;
          pdVar2[6] = dVar25;
          pdVar2[7] = dVar26;
          lVar52 = lVar52 + 8;
        } while (lVar52 < (long)uVar45);
      }
      if ((long)uVar45 < (long)uVar44) {
        do {
          pdVar19[uVar45] = pdVar20[uVar45];
          uVar45 = uVar45 + 1;
        } while (uVar44 != uVar45);
      }
      uVar44 = local_278 & 0xffffffff;
      if (0 < (int)local_278) {
        uVar45 = 0;
        do {
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              <= (long)uVar45) {
LAB_007df47d:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_270 = this->sigma;
          dVar70 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data[uVar45];
          pSVar39 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                              (&((this->LS_solver).
                                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_mat,lVar47 + uVar45,lVar47 + uVar45);
          *pSVar39 = *pSVar39 - (dVar70 + local_270);
          uVar45 = uVar45 + 1;
        } while (uVar44 != uVar45);
      }
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose != false) {
        pCVar40 = GetLog();
        pCVar41 = ChStreamOutAscii::operator<<
                            (&pCVar40->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
        lVar52 = std::chrono::_V2::system_clock::now();
        pCVar41 = ChStreamOutAscii::operator<<(pCVar41,(double)(lVar52 - lVar48) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar41,"s\n");
      }
      lVar52 = std::chrono::_V2::system_clock::now();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar40 = GetLog();
        pCVar41 = ChStreamOutAscii::operator<<
                            (&pCVar40->super_ChStreamOutAscii," Time for factorize : << ");
        lVar48 = std::chrono::_V2::system_clock::now();
        pCVar41 = ChStreamOutAscii::operator<<(pCVar41,(double)(lVar48 - lVar52) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar41,"s\n");
      }
      if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
        local_270 = (double)(ulong)nrows;
        uVar43 = 0;
LAB_007dda7f:
        IVar12 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar20 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1);
        }
        IVar13 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar19 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            IVar12) goto LAB_007df1ea;
        uVar45 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 7;
        if (-1 < l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
          uVar45 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows;
        }
        uVar45 = uVar45 & 0xfffffffffffffff8;
        if (7 < l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar52 = 0;
          do {
            pdVar1 = pdVar20 + lVar52;
            dVar70 = pdVar1[1];
            dVar8 = pdVar1[2];
            dVar22 = pdVar1[3];
            dVar23 = pdVar1[4];
            dVar24 = pdVar1[5];
            dVar25 = pdVar1[6];
            dVar26 = pdVar1[7];
            pdVar2 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar52;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar70;
            pdVar2[2] = dVar8;
            pdVar2[3] = dVar22;
            pdVar2[4] = dVar23;
            pdVar2[5] = dVar24;
            pdVar2[6] = dVar25;
            pdVar2[7] = dVar26;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if ((long)uVar45 <
            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = pdVar20[uVar45];
            uVar45 = uVar45 + 1;
          } while (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows != uVar45);
        }
        if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1);
        }
        IVar12 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar20 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            IVar13) goto LAB_007df1ea;
        uVar45 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 7;
        if (-1 < z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
          uVar45 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows;
        }
        uVar45 = uVar45 & 0xfffffffffffffff8;
        if (7 < z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar52 = 0;
          do {
            pdVar1 = pdVar19 + lVar52;
            dVar70 = pdVar1[1];
            dVar8 = pdVar1[2];
            dVar22 = pdVar1[3];
            dVar23 = pdVar1[4];
            dVar24 = pdVar1[5];
            dVar25 = pdVar1[6];
            dVar26 = pdVar1[7];
            pdVar2 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar52;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar70;
            pdVar2[2] = dVar8;
            pdVar2[3] = dVar22;
            pdVar2[4] = dVar23;
            pdVar2[5] = dVar24;
            pdVar2[6] = dVar25;
            pdVar2[7] = dVar26;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if ((long)uVar45 <
            z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = pdVar19[uVar45];
            uVar45 = uVar45 + 1;
          } while (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows != uVar45);
        }
        if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1);
        }
        if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            IVar12) goto LAB_007df1ea;
        uVar45 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 7;
        if (-1 < y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
          uVar45 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows;
        }
        uVar45 = uVar45 & 0xfffffffffffffff8;
        if (7 < y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar52 = 0;
          do {
            pdVar19 = pdVar20 + lVar52;
            dVar70 = pdVar19[1];
            dVar8 = pdVar19[2];
            dVar22 = pdVar19[3];
            dVar23 = pdVar19[4];
            dVar24 = pdVar19[5];
            dVar25 = pdVar19[6];
            dVar26 = pdVar19[7];
            pdVar1 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar52;
            *pdVar1 = *pdVar19;
            pdVar1[1] = dVar70;
            pdVar1[2] = dVar8;
            pdVar1[3] = dVar22;
            pdVar1[4] = dVar23;
            pdVar1[5] = dVar24;
            pdVar1[6] = dVar25;
            pdVar1[7] = dVar26;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if ((long)uVar45 <
            y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = pdVar20[uVar45];
            uVar45 = uVar45 + 1;
          } while (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows != uVar45);
        }
        if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          pcVar42 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007df451;
        }
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007df451;
        }
        if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007df451;
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007df451;
        }
        srcEvaluator.m_functor.m_other = 0.0;
        srcEvaluator._8_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                   y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ,1);
        pdVar3 = vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar2 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        IVar12 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar1 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar19 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        pdVar20 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if (srcEvaluator._8_8_ !=
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1);
        }
        uVar45 = local_278;
        if (srcEvaluator._8_8_ != IVar12) {
          pcVar42 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007df39f;
        }
        uVar46 = srcEvaluator._8_8_ + 7;
        if (-1 < (long)srcEvaluator._8_8_) {
          uVar46 = srcEvaluator._8_8_;
        }
        if (7 < (long)srcEvaluator._8_8_) {
          lVar52 = 0;
          do {
            auVar53 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(pdVar2 + lVar52));
            auVar54 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar52),
                                     *(undefined1 (*) [64])(pdVar19 + lVar52));
            auVar54 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(pdVar20 + lVar52));
            auVar53 = vaddpd_avx512f(auVar53,auVar54);
            auVar53 = vsubpd_avx512f(auVar53,*(undefined1 (*) [64])(pdVar1 + lVar52));
            *(undefined1 (*) [64])((long)srcEvaluator.m_functor.m_other + lVar52 * 8) = auVar53;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)(uVar46 & 0xfffffffffffffff8));
        }
        if ((long)(uVar46 & 0xfffffffffffffff8) < (long)srcEvaluator._8_8_) {
          lVar52 = (long)uVar46 >> 3;
          lVar48 = 0;
          do {
            *(double *)((long)srcEvaluator.m_functor.m_other + lVar52 * 0x40 + lVar48 * 8) =
                 ((pdVar3[lVar52 * 8 + lVar48] + pdVar19[lVar52 * 8 + lVar48]) *
                  pdVar20[lVar52 * 8 + lVar48] - pdVar2[lVar52 * 8 + lVar48]) -
                 pdVar1[lVar52 * 8 + lVar48];
            lVar48 = lVar48 + 1;
          } while ((long)srcEvaluator._8_8_ % 8 != lVar48);
        }
        peVar10 = (this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_2a0 = &peVar10->m_rhs;
        local_298 = 0;
        local_290 = 1;
        local_288 = k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows;
        pSVar15 = (Scalar *)
                  (peVar10->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
        if ((long)pSVar15 <
            k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007df183;
        }
        H._vptr_SparseMatrix =
             (_func_int **)
             (local_2a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        H._8_8_ = k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        H.m_outerSize = 1;
        if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
            H._vptr_SparseMatrix != (_func_int **)0x0) {
LAB_007df2b6:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        H.m_outerIndex = (StorageIndex *)0x0;
        H.m_innerNonZeros = (StorageIndex *)0x0;
        H.m_innerSize = (Index)local_2a0;
        H.m_data.m_values = pSVar15;
        if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0) {
LAB_007df2df:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_228._0_8_ = &dstEvaluator;
        local_228._8_8_ = &IS;
        local_218 = &local_3d9;
        local_210 = &H;
        dstEvaluator.
        super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
        .m_data = (PointerType)H._vptr_SparseMatrix;
        dstEvaluator.
        super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
        .m_outerStride.m_value = (long)pSVar15;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_228);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2a0,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator);
        if ((local_288 + local_298 !=
             (local_2a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows) || (local_290 != 1)) goto LAB_007df25e;
        lVar52 = std::chrono::_V2::system_clock::now();
        (*(((this->LS_solver).
            super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
        std::chrono::_V2::system_clock::now();
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar40 = GetLog();
          pCVar41 = ChStreamOutAscii::operator<<
                              (&pCVar40->super_ChStreamOutAscii," Time for solve : << ");
          lVar48 = std::chrono::_V2::system_clock::now();
          pCVar41 = ChStreamOutAscii::operator<<(pCVar41,(double)(lVar48 - lVar52) / 1000000000.0);
          ChStreamOutAscii::operator<<(pCVar41,"s\n");
        }
        peVar10 = (this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pdVar20 = (peVar10->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        if (pdVar20 != (double *)0x0 && (int)uVar45 < 0) goto LAB_007df2b6;
        if (((int)(nrows | uVar36) < 0) ||
           ((peVar10->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows < rows + lVar47)) goto LAB_007df2df;
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1);
        }
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            rows) {
          pcVar42 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007df39f;
        }
        uVar45 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
                 0xfffffffffffffff8;
        if (0 < (long)uVar45) {
          lVar52 = 0;
          do {
            auVar53 = vsubpd_avx512f(ZEXT864(0) << 0x40,
                                     *(undefined1 (*) [64])(pdVar20 + lVar47 + lVar52));
            *(undefined1 (*) [64])
             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar52) = auVar53;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if (uVar45 != l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) {
          do {
            auVar56._0_8_ = -pdVar20[lVar47 + uVar45];
            auVar56._8_8_ = 0x8000000000000000;
            dVar70 = (double)vmovlpd_avx(auVar56);
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = dVar70;
            uVar45 = uVar45 + 1;
          } while ((long)uVar45 <
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  );
        }
        peVar10 = (this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pdVar20 = (peVar10->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        if (pdVar20 != (double *)0x0 && (int)nrows < 0) goto LAB_007df2b6;
        if (((int)nrows < 0) ||
           ((peVar10->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows < lVar47)) goto LAB_007df2df;
        if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            lVar47) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar47,1);
        }
        pdVar2 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        IVar12 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        pdVar1 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar19 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            lVar47) {
          pcVar42 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007df39f;
        }
        uVar45 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
                 0xfffffffffffffff8;
        if (0 < (long)uVar45) {
          lVar52 = 0;
          do {
            pdVar3 = pdVar20 + lVar52;
            dVar70 = pdVar3[1];
            dVar8 = pdVar3[2];
            dVar22 = pdVar3[3];
            dVar23 = pdVar3[4];
            dVar24 = pdVar3[5];
            dVar25 = pdVar3[6];
            dVar26 = pdVar3[7];
            pdVar4 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar52;
            *pdVar4 = *pdVar3;
            pdVar4[1] = dVar70;
            pdVar4[2] = dVar8;
            pdVar4[3] = dVar22;
            pdVar4[4] = dVar23;
            pdVar4[5] = dVar24;
            pdVar4[6] = dVar25;
            pdVar4[7] = dVar26;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if (uVar45 != v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) {
          do {
            v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = pdVar20[uVar45];
            uVar45 = uVar45 + 1;
          } while ((long)uVar45 <
                   v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  );
        }
        if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007df335;
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007df451;
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1);
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            IVar12) {
          pcVar42 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007df39f;
        }
        uVar45 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 7;
        if (-1 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          uVar45 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        }
        uVar45 = uVar45 & 0xfffffffffffffff8;
        if (7 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar52 = 0;
          do {
            auVar53 = vdivpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar52),
                                     *(undefined1 (*) [64])(pdVar1 + lVar52));
            auVar53 = vaddpd_avx512f(auVar53,*(undefined1 (*) [64])(pdVar19 + lVar52));
            *(undefined1 (*) [64])
             (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar52) = auVar53;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if ((long)uVar45 <
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = pdVar2[uVar45] / pdVar1[uVar45] + pdVar19[uVar45];
            uVar45 = uVar45 + 1;
          } while (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar45);
        }
        (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&z);
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007df43c;
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Option = 1]"
          ;
          goto LAB_007df2ac;
        }
        if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>]"
          ;
          goto LAB_007df451;
        }
        if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar42 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007df39f;
        }
        uVar45 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 7;
        if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          uVar45 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        }
        uVar45 = uVar45 & 0xfffffffffffffff8;
        if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar52 = 0;
          do {
            auVar53 = vsubpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar52),
                                     *(undefined1 (*) [64])
                                      (z.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar52));
            auVar53 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])
                                              (vrho.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar52));
            auVar53 = vaddpd_avx512f(auVar53,*(undefined1 (*) [64])
                                              (y.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar52));
            *(undefined1 (*) [64])
             (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar52) = auVar53;
            lVar52 = lVar52 + 8;
          } while (lVar52 < (long)uVar45);
        }
        if ((long)uVar45 <
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar45] = (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data[uVar45] -
                       z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar45]) *
                       vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       .m_data[uVar45] +
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar45];
            uVar45 = uVar45 + 1;
          } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar45);
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007df43c;
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007df423;
        if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
        {
          H.m_outerSize = (Index)&z;
          H.m_innerSize = (Index)&l;
          H.m_innerNonZeros = (StorageIndex *)&S;
          if (0 < S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            local_210 = (ChSparseMatrix *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_208.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_200.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            dVar70 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_228,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
            goto LAB_007de325;
          }
LAB_007df3d6:
          H.m_outerSize = (Index)&z;
          pcVar42 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
          ;
          goto LAB_007df502;
        }
        dVar70 = 0.0;
LAB_007de325:
        this->r_prim = dVar70;
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0
             ) {
            local_3a8 = 0.0;
          }
          else {
            H._8_8_ = &z;
            H.m_outerSize = (Index)&l;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar42 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              goto LAB_007df502;
            }
            local_218 = (assign_op<double,_double> *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_210 = (ChSparseMatrix *)
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_3a8 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_228,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)&H);
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007df43c;
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
LAB_007df423:
            pcVar42 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007df451;
          }
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            pcVar42 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007df451;
          }
          if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0
             ) {
            dVar70 = 0.0;
          }
          else {
            H.m_innerSize = (Index)&z;
            H.m_outerIndex = (StorageIndex *)&z_old;
            H.m_data.m_values = (Scalar *)&vrho;
            H.m_data.m_size = (Index)&S;
            if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar42 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              goto LAB_007df502;
            }
            local_208.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_200.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_1f8.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_1f0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            dVar70 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_228,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
          }
          this->r_dual = dVar70;
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007df43c;
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) goto LAB_007df423;
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              == 0) {
            local_3b0 = 0.0;
          }
          else {
            H.m_outerSize = (Index)&z;
            H.m_innerSize = (Index)&z_old;
            H.m_innerNonZeros = (StorageIndex *)&vrho;
            if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                < 1) goto LAB_007df3d6;
            local_210 = (ChSparseMatrix *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_208.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_200.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_3b0 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_228,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)&H);
          }
          if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
            pCVar40 = GetLog();
            pCVar41 = ChStreamOutAscii::operator<<(&pCVar40->super_ChStreamOutAscii,"ADMM iter=");
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,uVar43);
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41," prim=");
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,this->r_prim);
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41," dual=");
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,this->r_dual);
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,"  rho=");
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,__tmp_1);
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,"  tols=");
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,this->tol_prim);
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41," ");
            pCVar41 = ChStreamOutAscii::operator<<(pCVar41,this->tol_dual);
            ChStreamOutAscii::operator<<(pCVar41,"\n");
          }
          if ((this->super_ChIterativeSolverVI).record_violation_history != true) {
LAB_007de80d:
            if ((this->r_prim < this->tol_prim) && (this->r_dual < this->tol_dual)) {
              if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)
              {
                pCVar40 = GetLog();
                pCVar41 = ChStreamOutAscii::operator<<
                                    (&pCVar40->super_ChStreamOutAscii,"ADMM converged ok! at iter=")
                ;
                pCVar41 = ChStreamOutAscii::operator<<(pCVar41,uVar43);
                ChStreamOutAscii::operator<<(pCVar41,"\n");
              }
              if (srcEvaluator.m_functor.m_other != 0.0) {
                free(*(void **)((long)srcEvaluator.m_functor.m_other + -8));
              }
              goto LAB_007ded23;
            }
            if ((int)uVar43 % this->stepadjust_each == 0) {
              auVar58 = ZEXT816(0x3ff0000000000000);
              if (this->stepadjust_type == BALANCED_UNSCALED) {
                auVar60._0_8_ = local_3a8 / local_3b0;
                auVar60._8_8_ = 0;
                if (auVar60._0_8_ < 0.0) {
                  auVar65._0_8_ = sqrt(auVar60._0_8_);
                  auVar65._8_56_ = extraout_var_01;
                  auVar58 = auVar65._0_16_;
                }
                else {
                  auVar58 = vsqrtsd_avx(auVar60,auVar60);
                }
              }
              if (this->stepadjust_type == BALANCED_FAST) {
                auVar61 = ZEXT816(0) << 0x40;
                auVar62 = ZEXT816(0) << 0x40;
                if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  local_228._0_8_ = &z;
                  if (0 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows) {
                    H._8_8_ = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data;
                    auVar66._0_8_ =
                         Eigen::internal::
                         redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&H,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                     *)local_228);
                    auVar66._8_56_ = extraout_var_02;
                    auVar62 = auVar66._0_16_;
                    auVar61 = ZEXT816(0);
                    goto LAB_007de8e4;
                  }
LAB_007df4ed:
                  pcVar42 = 
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                  ;
LAB_007df502:
                  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                                ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar42);
                }
LAB_007de8e4:
                local_268 = auVar62._0_8_;
                if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  local_228._0_8_ = &l;
                  if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows < 1) goto LAB_007df4ed;
                  H._8_8_ = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                  auVar67._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&H,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                   *)local_228);
                  auVar67._8_56_ = extraout_var_03;
                  auVar61 = auVar67._0_16_;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = local_268;
                }
                dVar70 = 1e-10;
                if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  local_228._0_8_ = &y;
                  if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows < 1) goto LAB_007df4ed;
                  H._8_8_ = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                  SVar55 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&H,(scalar_max_op<double,_double,_0> *)&local_2a0,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       *)local_228);
                  dVar70 = SVar55 + 1e-10;
                  auVar61._8_8_ = 0;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = local_268;
                }
                auVar58 = vmaxsd_avx(auVar62,auVar61);
                auVar63._0_8_ = (local_3a8 / (auVar58._0_8_ + 1e-10)) / (local_3b0 / dVar70 + 1e-10)
                ;
                auVar63._8_8_ = 0;
                if (auVar63._0_8_ < 0.0) {
                  auVar68._0_8_ = sqrt(auVar63._0_8_);
                  auVar68._8_56_ = extraout_var_04;
                  auVar58 = auVar68._0_16_;
                }
                else {
                  auVar58 = vsqrtsd_avx(auVar63,auVar63);
                }
              }
              if (this->stepadjust_type == BALANCED_RANGE) {
                auVar64._0_8_ =
                     (this->r_prim / this->tol_prim) / (this->r_dual / this->tol_dual + 1e-10);
                auVar64._8_8_ = 0;
                if (auVar64._0_8_ < 0.0) {
                  auVar69._0_8_ = sqrt(auVar64._0_8_);
                  auVar69._8_56_ = extraout_var_05;
                  auVar58 = auVar69._0_16_;
                }
                else {
                  auVar58 = vsqrtsd_avx(auVar64,auVar64);
                }
              }
              auVar71._8_8_ = 0;
              auVar71._0_8_ = this->stepadjust_maxfactor;
              auVar72._0_8_ = 1.0 / this->stepadjust_maxfactor;
              auVar72._8_8_ = 0;
              auVar58 = vmaxsd_avx(auVar72,auVar58);
              auVar58 = vminsd_avx(auVar71,auVar58);
              dVar70 = auVar58._0_8_;
              if ((this->stepadjust_threshold < dVar70) ||
                 (dVar70 < 1.0 / this->stepadjust_threshold)) {
                local_268 = dVar70;
                lVar52 = std::chrono::_V2::system_clock::now();
                if (0 < (int)local_278) {
                  uVar45 = 0;
                  do {
                    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows <= (long)uVar45) goto LAB_007df47d;
                    dVar70 = this->sigma;
                    dVar8 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data[uVar45];
                    pSVar39 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                        (&((this->LS_solver).
                                           super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_mat,(long)local_270 + uVar45,
                                         (long)local_270 + uVar45);
                    *pSVar39 = dVar8 + dVar70 + *pSVar39;
                    uVar45 = uVar45 + 1;
                  } while (uVar44 != uVar45);
                }
                if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 0) goto LAB_007df59c;
                dVar70 = __tmp_1 * local_268;
                if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != 0) {
                  lVar48 = 0;
                  do {
                    *(double *)
                     ((long)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data + lVar48) = dVar70;
                    lVar48 = lVar48 + 8;
                  } while (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows * 8 - lVar48 != 0);
                }
                ppCVar38 = (sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                lVar48 = (long)(sysd->vconstraints).
                               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar38;
                if (lVar48 != 0) {
                  iVar37 = 0;
                  uVar45 = 1;
                  uVar46 = 0;
                  do {
                    uVar50 = uVar45;
                    pCVar9 = ppCVar38[uVar46];
                    if (pCVar9->active == true) {
                      if (pCVar9->mode == CONSTRAINT_LOCK) {
                        if ((iVar37 < 0) ||
                           (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows <= iVar37)) goto LAB_007df47d;
                        vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[iVar37] = this->rho_b;
                      }
                      iVar37 = iVar37 + 1;
                    }
                    uVar45 = (ulong)((int)uVar50 + 1);
                    uVar46 = uVar50;
                  } while (uVar50 < (ulong)(lVar48 >> 3));
                }
                __tmp_1 = dVar70;
                if (0 < (int)local_278) {
                  uVar45 = 0;
                  do {
                    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows <= (long)uVar45) goto LAB_007df47d;
                    dVar70 = this->sigma;
                    dVar8 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data[uVar45];
                    pSVar39 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                        (&((this->LS_solver).
                                           super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_mat,(long)local_270 + uVar45,
                                         (long)local_270 + uVar45);
                    *pSVar39 = *pSVar39 - (dVar8 + dVar70);
                    uVar45 = uVar45 + 1;
                  } while (uVar44 != uVar45);
                }
                (*(((this->LS_solver).
                    super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
                std::chrono::_V2::system_clock::now();
                if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose ==
                    true) {
                  pCVar40 = GetLog();
                  pCVar41 = ChStreamOutAscii::operator<<
                                      (&pCVar40->super_ChStreamOutAscii,
                                       " Time for re-factorize : << ");
                  lVar48 = std::chrono::_V2::system_clock::now();
                  pCVar41 = ChStreamOutAscii::operator<<
                                      (pCVar41,(double)(lVar48 - lVar52) / 1000000000.0);
                  ChStreamOutAscii::operator<<(pCVar41,"s\n");
                }
              }
            }
            if (srcEvaluator.m_functor.m_other != 0.0) {
              free(*(void **)((long)srcEvaluator.m_functor.m_other + -8));
            }
            uVar43 = uVar43 + 1;
            if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <=
                (int)uVar43) goto LAB_007ded23;
            goto LAB_007dda7f;
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
            goto LAB_007df423;
            H.m_outerSize = (Index)&z;
            H.m_innerSize = (Index)&l;
            H.m_innerNonZeros = (StorageIndex *)&S;
            if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                0) {
              local_268 = 0.0;
              uStack_260 = 0;
            }
            else {
              if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  < 1) {
                pcVar42 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007df502;
              }
              local_210 = (ChSparseMatrix *)
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data;
              local_208.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              local_200.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              local_268 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                          ::
                          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                      *)local_228,(scalar_sum_op<double,_double> *)&local_2a0,
                                     (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      *)&H);
              uStack_260 = extraout_XMM0_Qb;
            }
            if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) goto LAB_007df43c;
            if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows) {
              pcVar42 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_007df451;
            }
            H.m_outerSize = (Index)&z;
            H.m_innerSize = (Index)&z_old;
            H.m_innerNonZeros = (StorageIndex *)&S;
            if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                0) {
              auVar57 = ZEXT816(0) << 0x40;
            }
            else {
              if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  < 1) {
                pcVar42 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007df502;
              }
              local_210 = (ChSparseMatrix *)
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data;
              local_208.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
              local_200.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              auVar53._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_228,(scalar_sum_op<double,_double> *)&local_2a0,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&H);
              auVar53._8_56_ = extraout_var;
              auVar57 = auVar53._0_16_;
            }
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              H._8_8_ = &l;
              H.m_outerSize = (Index)&l_old;
              if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows == 0) {
                auVar58 = SUB6416(ZEXT864(0),0) << 0x40;
              }
              else {
                if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) {
                  pcVar42 = 
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                  ;
                  goto LAB_007df502;
                }
                local_218 = (assign_op<double,_double> *)
                            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                local_210 = (ChSparseMatrix *)
                            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                auVar54._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_228,(scalar_sum_op<double,_double> *)&local_2a0,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&H);
                auVar54._8_56_ = extraout_var_00;
                auVar58 = auVar54._0_16_;
                auVar57._8_8_ = 0;
              }
              auVar56 = vsqrtsd_avx(auVar58,auVar58);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_268;
              auVar58 = vsqrtpd_avx(auVar59);
              auVar57 = vsqrtsd_avx(auVar57,auVar57);
              ChIterativeSolverVI::AtIterationEnd
                        (&this->super_ChIterativeSolverVI,auVar58._0_8_ + auVar57._0_8_,
                         auVar56._0_8_,uVar43);
              goto LAB_007de80d;
            }
          }
        }
LAB_007df43c:
        pcVar42 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007df451;
      }
LAB_007ded23:
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          uVar44 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 7;
          if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ) {
            uVar44 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          uVar44 = uVar44 & 0xfffffffffffffff8;
          if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            lVar47 = 0;
            do {
              auVar53 = vmulpd_avx512f(*(undefined1 (*) [64])
                                        (l.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar47),
                                       *(undefined1 (*) [64])
                                        (S.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar47));
              *(undefined1 (*) [64])
               (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar47) = auVar53;
              lVar47 = lVar47 + 8;
            } while (lVar47 < (long)uVar44);
          }
          if ((long)uVar44 <
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            do {
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar44] = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar44] *
                         S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar44];
              uVar44 = uVar44 + 1;
            } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows != uVar44);
          }
          (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&l);
          (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&v);
          local_398 = this->r_dual;
          ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              != (double *)0x0) {
            free((void *)l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[-1]);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          A._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
          free(A.m_outerIndex);
          free(A.m_innerNonZeros);
          Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&A.m_data);
          if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
          free(E.m_outerIndex);
          free(E.m_innerNonZeros);
          Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&E.m_data);
          Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
          free(Cq.m_outerIndex);
          free(Cq.m_innerNonZeros);
          Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&Cq.m_data);
LAB_007df12c:
          if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
              (double *)0x0) {
            free((void *)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[-1]);
          }
          return local_398;
        }
        goto LAB_007df609;
      }
LAB_007df5ef:
      pcVar42 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007df451;
    }
  }
LAB_007df1ea:
  pcVar42 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
  ;
LAB_007df39f:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar42);
}

Assistant:

double ChSolverADMM::_SolveBasic(ChSystemDescriptor& sysd) {

    ChTimer<> m_timer_convert;
    ChTimer<> m_timer_factorize;
    ChTimer<> m_timer_solve;

    double rho_i = this->rho;

    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();

    int nc = sysd.CountActiveConstraints();
    int nv = sysd.CountActiveVariables();

    ChVectorDynamic<> v(nv);

    // shortcut for the case of no constraints:
    if (nc == 0) {

        ChSparseMatrix H(nv, nv);
        ChVectorDynamic<> k(nv);


        m_timer_convert.start();

        // sysd.ConvertToMatrixForm(0, &LS_solver->A(), 0, &LS_solver->b(), 0, 0, 0);
        //sysd.ConvertToMatrixForm(0, &LS_solver->A(), 0, &LS_solver->b(), 0, 0, 0);
        // much faster to fill brand new sparse matrices??!!

        ChSparsityPatternLearner sparsity_pattern(nv, nv);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0); 
        sparsity_pattern.Apply(H);
        sysd.ConvertToMatrixForm(&H,&k);  
        LS_solver->A() = H; 
        LS_solver->b() = k; 

        m_timer_convert.stop();
        if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

        // v = H\k
        LS_solver->SetupCurrent();
        LS_solver->SolveCurrent();

        //v = LS_solver->x();
        sysd.FromVectorToVariables(LS_solver->x());

        return 0;
    }
        
    ChSparseMatrix Cq(nc,nv);
    ChSparseMatrix E(nc,nc);
    ChVectorDynamic<> k(nv);
    ChVectorDynamic<> b(nc);

    ChSparseMatrix    A(nv+nc,nv+nc);
    ChVectorDynamic<> B(nv+nc);
    //ChVectorDynamic<> X(nv+nc);


    ChVectorDynamic<> l(nc);
    ChVectorDynamic<> z(nc);
    ChVectorDynamic<> y(nc);

    ChVectorDynamic<> l_old(nc);
    ChVectorDynamic<> z_old(nc);
    ChVectorDynamic<> y_old(nc);
    
    sysd.ConvertToMatrixForm(&Cq, 0, &E, &k, &b, 0);
    Cq.makeCompressed();
    E.makeCompressed();

    if (!this->m_warm_start) {
        l.setZero();
        z.setZero();
        y.setZero();
    }
    else
    {
        // warmstarted l:
        sysd.FromConstraintsToVector(l, false);

        // warmstarted v:
        //v = H\(k + D*l); // PERFORMANCE HIT, probably better reuse last v if possible..
        sysd.FromVariablesToVector(v, false); // this works supposing that variables have been warmstarted with "v" too, otherwise:  

        // warmstarted y:
        // the following correct only if r_dual was approx.=0. //***TODO*** as parameter
        y = - (Cq*v - E*l + b); //  dual residual exploiting the kkt form instead of - (N*l+r), faster!
            
        /*
        GetLog() << "Y warmastarted:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
        */
        
        // warmstarted z:
        z = l; //  warm start also this - should project? //***TODO*** as parameter
        //sysd.ConstraintsProject(z);

        // y_hat  = y;   // only for spectral stepsize
    }

    ChVectorDynamic<> S(nc);

    if (this->precond == true) {
        // Compute diagonal values of N , only mass effect, neglecting stiffness for the moment, TODO
        //  g_i=[Cq_i]*[invM_i]*[Cq_i]' 
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Update_auxiliary();

        // Average all g_i for the triplet of contact constraints n,u,v.
        int j_friction_comp = 0;
        double gi_values[3];
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
                j_friction_comp++;
                if (j_friction_comp == 3) {
                    double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                    mconstraints[ic - 2]->Set_g_i(average_g_i);
                    mconstraints[ic - 1]->Set_g_i(average_g_i);
                    mconstraints[ic - 0]->Set_g_i(average_g_i);
                    j_friction_comp = 0;
                }
            }
        }
        // The vector with the diagonal of the N matrix
        S.setZero();
        int d_i = 0;
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive()) {
                S(d_i, 0) = sqrt(mconstraints[ic]->Get_g_i());  // square root of diagonal of N, just mass matrices considered, no stiffness matrices anyway
                ++d_i;
            }
        // Now we should scale Cq, E, b as
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        
        // but to avoid storing Cq and E and assembly in A, we postpone this by scaling the entire A matrix later via a IS*A*IS operation
        
        // b = diag(S)*b;
        b = b.cwiseProduct(S);

        // warm started values must be scaled too
        l = l.cwiseQuotient(S); // from l to \breve{l}
        z = z.cwiseQuotient(S); 
        y = y.cwiseProduct(S);

    }
    else {
        S.setConstant(1);
    }  

    // vsigma = ones(nconstr,1)*sigma;
    ChVectorDynamic<> vsigma(nc); // not needed
    vsigma.setConstant(this->sigma);
    

    // vrho = ones(nconstr,1)*rho;
    ChVectorDynamic<> vrho(nc);
    vrho.setConstant(rho_i);

    // vrho(fric==-2) = rho_b;          // special step for bilateral joints
    int s_c = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive()) {
            if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                vrho(s_c) = rho_b;
            s_c++;
        }
    }
 
    // FACTORIZATION
    //
    // A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    
    m_timer_convert.start();

    LS_solver->A().resize(nv + nc, nv + nc); // otherwise conservativeResize in ConvertToMatrixForm() causes error

    //sysd.ConvertToMatrixForm(&LS_solver->A(),&LS_solver->b());  // A = [M, Cq'; Cq, E ];
    // much faster to fill brand new sparse matrices??!!
    ChSparsityPatternLearner sparsity_pattern(nv + nc, nv + nc);
    sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
    sparsity_pattern.Apply(A);

    sysd.ConvertToMatrixForm(&A,&B);  // A = [M, Cq'; Cq, E ]; 

    if (this->precond) {
        // the following is equivalent to having scaled 
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        ChVectorDynamic<> IS(nv + nc);
        IS << Eigen::VectorXd::Ones(nv) , S;
        A = IS.asDiagonal() * A * IS.asDiagonal();
        B = IS.asDiagonal() * B; // not needed? B here only factorization...
    }

    LS_solver->A() = A; 
    LS_solver->b() = B; 

    for (int i = 0; i < nc; ++i)
        LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    m_timer_convert.stop();
    if (this->verbose)
        GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

    m_timer_factorize.start();

    LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

    m_timer_factorize.stop();
    if (this->verbose)
        GetLog() << " Time for factorize : << " << m_timer_factorize.GetTimeSecondsIntermediate() << "s\n";

    /*
    res_story.r_prim=zeros(1,1);
    res_story.r_dual_Nlry=zeros(1,1);
    res_story.r_dual=zeros(1,1);
    res_story.r_combined_pre=zeros(1,1);
    res_story.r_combined=zeros(1,1);
    res_story.r_deltal=zeros(1,1);
    res_story.r_rho=zeros(1,1);
    res_story.r_violation=zeros(1,1);
    */

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // diagnostic
        l_old = l;
        z_old = z;
        y_old = y;

        // X   (lambda)

        // SOLVE LINEAR SYSTEM HERE
        // ckkt = -bkkt + (vsigma+vrho).*z - y;

        ChVectorDynamic<> ckkt = -b + (vsigma + vrho).cwiseProduct(z) - y;
        LS_solver->b() << k, ckkt;  // B = [k;ckkt];

        m_timer_solve.start();

        LS_solver->SolveCurrent();                                                      // LU forward/backsolve ++++++++++++++++++++++++++++++++++++++
        
        m_timer_solve.stop();
        if (this->verbose) GetLog() << " Time for solve : << " << m_timer_solve.GetTimeSecondsIntermediate() << "s\n";

        // x = dA\B;      // A* x = B  with x = [v, -l]    
        l = -LS_solver->x().block(nv, 0, nc, 1);
        v =  LS_solver->x().block(0, 0, nv, 1);
        

        // Z

        //    z = project_orthogonal(l + y. / vrho, fric); 
        z = l + y.cwiseQuotient(vrho);
        sysd.ConstraintsProject(z); 

        // Y

        y = y + vrho.asDiagonal() * (l - z);


        // y_hat = y + vrho .* (l - z_old);   


        // Compute residuals for tolerances


        r_prim = ((z - l).cwiseProduct(S)).lpNorm<Eigen::Infinity>();     //r_prim     = norm((z - l).*S, inf);   
        double r_prim_pre = (z - l).lpNorm<Eigen::Infinity>();              //r_prim_pre = norm((z - l)   , inf); 

        r_dual = (((z - z_old).cwiseProduct(vrho)).cwiseQuotient(S)).lpNorm<Eigen::Infinity>(); // r_dual = norm((vrho.*(z - z_old)). / S, inf); % even faster!See book of Boyd.But coincides only for alpha = 1 !!!
        double r_dual_pre = ((z - z_old).cwiseProduct(vrho)).lpNorm<Eigen::Infinity>();  // r_dual_pre     = norm((vrho.*(z - z_old))   ,inf); 

        //r_combined = norm((z - l).*S, 2) + norm((z - z_old). / S, 2);% combined res.in original metric
        //r_combined_pre = norm((z - l), 2) + norm((z - z_old), 2);% combined res.in precond.metric

        /*
        res_story.r_prim(j) = r_prim;
        res_story.r_dual_Nlry(j) = r_dual_Nlry;
        res_story.r_dual(j) = r_dual;
        res_story.r_combined_pre(j) = r_combined_pre;
        res_story.r_combined(j) = r_combined;
        res_story.r_rho(j) = rho_i;
        res_story.r_deltal(j) = norm((l - l_old).*S, inf);% diagnostic
        */

        if (this->verbose)
            GetLog() << "ADMM iter=" << iter << " prim=" << r_prim << " dual=" << r_dual << "  rho=" << rho_i << "  tols=" << this->tol_prim << " " << this->tol_dual <<  "\n";

        // For recording into violation history, if debugging
        if (this->record_violation_history) {
            // combined residual 
            double r_combined = ((z - l).cwiseProduct(S)).norm() + ((z - z_old).cwiseQuotient(S)).norm();
            AtIterationEnd(r_combined, (l - l_old).norm(), iter);
        }

        // Termination:
        if ((r_prim < this->tol_prim) && (r_dual < this->tol_dual)) {
            if (this->verbose)
                GetLog() << "ADMM converged ok! at iter=" << iter << "\n";
            break;
        }



        // once in a while update the rho step parameter
        if ((iter % this->stepadjust_each) == 0) {

            double rhofactor = 1; // default do not shrink / enlarge

            if (this->stepadjust_type == AdmmStepType::NONE) {
                rhofactor = 1.;
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_UNSCALED) {
                rhofactor = sqrt(r_prim_pre / r_dual_pre);
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_FAST) {
                double r_prim_scaled = r_prim_pre / (ChMax(z.lpNorm<Eigen::Infinity>(), l.lpNorm<Eigen::Infinity>()) + 1e-10); // maybe norm(l, inf) very similar to norm(z, inf)
                double r_dual_scaled = r_dual_pre / (y.lpNorm<Eigen::Infinity>() + 1e-10);  //  as in "ADMM Penalty Parameter Selection by Residual Balancing", Brendt Wohlberg
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_RANGE) {
                double r_prim_scaled = r_prim / this->tol_prim;
                double r_dual_scaled = r_dual / this->tol_dual;
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }


            // safeguards against extreme shrinking
            if (rhofactor < 1.0 / this->stepadjust_maxfactor) {
                rhofactor = 1.0 / this->stepadjust_maxfactor;
            }
            if (rhofactor > this->stepadjust_maxfactor) {
                rhofactor = this->stepadjust_maxfactor;
            }

            if ((rhofactor > this->stepadjust_threshold) || (rhofactor < 1.0 / this->stepadjust_threshold)) {

                ChTimer<> m_timer_refactorize;
                m_timer_refactorize.start();

                // Avoid rebuilding all sparse matrix: 
                // A) just remove old rho with -= :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) -= -(sigma + vrho(i));

                // Update rho
                rho_i = rho_i * rhofactor;

                // vrho(fric == -2) = rho_b; //  special step for bilateral joints
                vrho.setConstant(rho_i);
                s_c = 0;
                for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
                    if (mconstraints[ic]->IsActive()) {
                        if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                            vrho(s_c) = rho_b;
                        s_c++;
                    }
                }

                // UPDATE FACTORIZATION
                //
                //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];
                //
                // To avoid rebuilding A, we just removed the rho step from the diagonal in A), and now: 
                // B) add old rho with += :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));

                LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

                m_timer_refactorize.stop();
                if (this->verbose) GetLog() << " Time for re-factorize : << " << m_timer_refactorize.GetTimeSecondsIntermediate() << "s\n";
            }

        } // end step adjust


    } // end iteration

    l = l.cwiseProduct(S);

    /*
    GetLog() << "Y resulting:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
    */

    sysd.FromVectorToConstraints(l);
    sysd.FromVectorToVariables(v);

    return r_dual;
}